

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O3

SignatureT __thiscall
wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::makeFuncType
          (TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx> *this,ParamsT *params,ResultsT *results)

{
  pointer pNVar1;
  Type TVar2;
  Type *__args;
  pointer pNVar3;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *__x;
  SignatureT SVar4;
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_98;
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_80;
  undefined1 auStack_68 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> empty;
  undefined1 auStack_48 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> types;
  
  auStack_68 = (undefined1  [8])0x0;
  empty.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  empty.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if (params == (ParamsT *)0x0) {
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_48,
               (vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_68);
  }
  else {
    auStack_48 = (undefined1  [8])0x0;
    types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::reserve
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_48,
               ((long)(params->super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(params->super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>).
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    pNVar3 = (params->super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pNVar1 = (params->super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pNVar3 != pNVar1) {
      __args = &pNVar3->type;
      do {
        if (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_start ==
            types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<wasm::Type,std::allocator<wasm::Type>>::_M_realloc_insert<wasm::Type_const&>
                    ((vector<wasm::Type,std::allocator<wasm::Type>> *)auStack_48,
                     (iterator)
                     types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                     super__Vector_impl_data._M_start,__args);
        }
        else {
          (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_start)->id = __args->id;
          types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start =
               types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
        pNVar3 = (pointer)(__args + 1);
        __args = __args + 3;
      } while (pNVar3 != pNVar1);
    }
  }
  __x = (vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_68;
  if (results != (ResultsT *)0x0) {
    __x = results;
  }
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
            (&local_98,(vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_48);
  SVar4.params = TypeBuilder::getTempTupleType((TypeBuilder *)this[0xc].typeIndices,&local_98);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector(&local_80,__x);
  TVar2 = TypeBuilder::getTempTupleType((TypeBuilder *)this[0xc].typeIndices,&local_80);
  if (local_80.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_98.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (auStack_48 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_48,
                    (long)types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)auStack_48);
  }
  if (auStack_68 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_68,
                    (long)empty.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)auStack_68);
  }
  SVar4.results.id = TVar2.id;
  return SVar4;
}

Assistant:

SignatureT makeFuncType(ParamsT* params, ResultsT* results) {
    std::vector<Type> empty;
    const auto& paramTypes = params ? getUnnamedTypes(*params) : empty;
    const auto& resultTypes = results ? *results : empty;
    return Signature(self().makeTupleType(paramTypes),
                     self().makeTupleType(resultTypes));
  }